

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

int cipher_setup_crypto(ptls_cipher_context_t *_ctx,void *key,EVP_CIPHER *cipher,
                       _func_void_ptls_cipher_context_t_ptr_void_ptr_void_ptr_size_t *do_transform)

{
  int iVar1;
  EVP_CIPHER_CTX *ctx;
  int iVar2;
  
  _ctx->do_dispose = cipher_dispose;
  _ctx->do_init = cipher_do_init;
  _ctx->do_transform = cipher_encrypt;
  ctx = EVP_CIPHER_CTX_new();
  _ctx[1].algo = (st_ptls_cipher_algorithm_t *)ctx;
  if (ctx == (EVP_CIPHER_CTX *)0x0) {
    iVar2 = 0x201;
  }
  else {
    iVar2 = 0;
    iVar1 = EVP_EncryptInit_ex(ctx,(EVP_CIPHER *)cipher,(ENGINE *)0x0,(uchar *)key,(uchar *)0x0);
    if (iVar1 == 0) {
      EVP_CIPHER_CTX_free((EVP_CIPHER_CTX *)_ctx[1].algo);
      iVar2 = 0x203;
    }
  }
  return iVar2;
}

Assistant:

static int cipher_setup_crypto(ptls_cipher_context_t *_ctx, const void *key, const EVP_CIPHER *cipher,
                               void (*do_transform)(ptls_cipher_context_t *, void *, const void *, size_t))
{
    struct cipher_context_t *ctx = (struct cipher_context_t *)_ctx;

    ctx->super.do_dispose = cipher_dispose;
    ctx->super.do_init = cipher_do_init;
    ctx->super.do_transform = do_transform;

    if ((ctx->evp = EVP_CIPHER_CTX_new()) == NULL)
        return PTLS_ERROR_NO_MEMORY;
    if (!EVP_EncryptInit_ex(ctx->evp, cipher, NULL, key, NULL)) {
        EVP_CIPHER_CTX_free(ctx->evp);
        return PTLS_ERROR_LIBRARY;
    }

    return 0;
}